

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_mathutils.cc
# Opt level: O0

SpatialMatrix *
RigidBodyDynamics::Math::XtransRotZYXEuler(Vector3d *displacement,Vector3d *zyx_euler)

{
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *in_RDI;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *this;
  MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *in_stack_fffffffffffffb18;
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>_>
  *in_stack_fffffffffffffb20;
  double *in_stack_fffffffffffffd98;
  double *in_stack_fffffffffffffda8;
  Vector3d *in_stack_fffffffffffffdc8;
  
  this = in_RDI;
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[](in_RDI,(Index)in_RDI);
  Xrotz_mat(in_stack_fffffffffffffda8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[](this,(Index)in_RDI);
  Xroty_mat(in_stack_fffffffffffffda8);
  Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)this,
             (MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)in_RDI);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[](this,(Index)in_RDI);
  Xrotx_mat(in_stack_fffffffffffffd98);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,6,0,6,6>,0>>::
  operator*((MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>_>
             *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  Xtrans_mat(in_stack_fffffffffffffdc8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,6,0,6,6>,0>,Eigen::Matrix<double,6,6,0,6,6>,0>>
  ::operator*(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  SpatialMatrix_t::
  SpatialMatrix_t<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,6,0,6,6>,0>,Eigen::Matrix<double,6,6,0,6,6>,0>,Eigen::Matrix<double,6,6,0,6,6>,0>>
            ((SpatialMatrix_t *)this,
             (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>_>
              *)in_RDI);
  return (SpatialMatrix *)this;
}

Assistant:

RBDL_DLLAPI
SpatialMatrix XtransRotZYXEuler (const Vector3d &displacement, const Vector3d &zyx_euler) {
	return Xrotz_mat(zyx_euler[0]) * Xroty_mat(zyx_euler[1]) * Xrotx_mat(zyx_euler[2]) * Xtrans_mat(displacement);
}